

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O2

bool __thiscall QApplicationPrivate::windowNeverBlocked(QApplicationPrivate *this,QWindow *window)

{
  QWidget *this_00;
  QWindow *pQVar1;
  
  this_00 = QApplication::activePopupWidget();
  if (this_00 == (QWidget *)0x0) {
    if (window == (QWindow *)0x0) {
      return true;
    }
  }
  else {
    pQVar1 = QWidget::windowHandle(this_00);
    if (pQVar1 == window) {
      return true;
    }
    if (pQVar1 != (QWindow *)0x0) {
      return false;
    }
  }
  return *(char *)(*(long *)(window + 8) + 0x7c) == '\t';
}

Assistant:

bool QApplicationPrivate::windowNeverBlocked(QWindow *window) const
{
    QWidget *popupWidget = QApplication::activePopupWidget();
    QWindow *popupWindow = popupWidget ? popupWidget->windowHandle() : nullptr;
    return popupWindow == window || (!popupWindow && QWindowPrivate::get(window)->isPopup());
}